

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_gemm.hpp
# Opt level: O0

void remora::bindings::
     dense_gemm<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *e1,matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                    *e2,matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *m,value_type alpha)

{
  dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *pdVar1;
  dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *this;
  unsigned_long *puVar2;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDX;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  undefined8 in_XMM0_Qa;
  type As;
  size_t mc;
  size_t i;
  type Bs;
  size_t kc;
  size_t l;
  size_t nc;
  size_t j;
  size_t ldc;
  double *C_;
  storage_type storageM;
  size_t kb;
  size_t nb;
  size_t mb;
  size_t K;
  size_t N;
  size_t M;
  value_type *B;
  value_type *A;
  aligned_allocator<double,_64UL> allocator;
  pointer in_stack_fffffffffffffec8;
  aligned_allocator<double,_64UL> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  const_void_pointer in_stack_fffffffffffffee8;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffef0;
  aligned_allocator<double,_64UL> *in_stack_fffffffffffffef8;
  unsigned_long local_f8;
  unsigned_long local_f0;
  ulong local_e8;
  undefined1 local_d8 [32];
  unsigned_long local_b8;
  unsigned_long local_b0;
  ulong local_a8;
  unsigned_long local_a0;
  unsigned_long local_98;
  ulong local_90;
  pointer local_88;
  double *local_80;
  storage_type local_78;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  size_type local_50;
  size_type local_48;
  size_type local_40;
  pointer local_38;
  pointer local_30;
  undefined8 local_20;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_8;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_30 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8);
  local_38 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_18);
  local_40 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
             ::size1(pdVar1);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_18);
  local_48 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
             ::size2(pdVar1);
  this = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(local_8);
  local_50 = dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
             ::size2(this);
  local_58 = local_40 + 0x7f >> 7;
  local_60 = (local_48 + 0x3fb) / 0x3fc;
  local_68 = local_50 + 0x1ff >> 9;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(local_18);
  local_78 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
             ::raw_storage((dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                            *)0x112c40);
  local_80 = local_78.values;
  local_88 = (pointer)local_78.leading_dimension;
  for (local_90 = 0; local_90 < local_60; local_90 = local_90 + 1) {
    local_a0 = local_48 + local_90 * -0x3fc;
    puVar2 = std::min<unsigned_long>
                       (&dense_gemm<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>_>
                         ::NC,&local_a0);
    local_98 = *puVar2;
    for (local_a8 = 0; local_a8 < local_68; local_a8 = local_a8 + 1) {
      local_b8 = local_50 + local_a8 * -0x200;
      puVar2 = std::min<unsigned_long>
                         (&dense_gemm<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>_>
                           ::KC,&local_b8);
      local_b0 = *puVar2;
      subrange<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
                (in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (size_t)in_stack_fffffffffffffed0);
      pack_B_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
                (local_d8,local_38);
      for (local_e8 = 0; local_e8 < local_58; local_e8 = local_e8 + 1) {
        local_f8 = local_40 + local_e8 * -0x80;
        puVar2 = std::min<unsigned_long>
                           (&dense_gemm<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>_>
                             ::MC,&local_f8);
        local_f0 = *puVar2;
        subrange<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
                  ((matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                    *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   (size_t)in_stack_fffffffffffffed0);
        pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
                  (&stack0xfffffffffffffee8,local_30);
        in_stack_fffffffffffffed0 = (aligned_allocator<double,_64UL> *)0x1;
        in_stack_fffffffffffffec8 = local_88;
        mgemm<double,double,remora::bindings::gemm_block_size<double>>
                  (local_20,local_f0,local_98,local_b0,local_30,local_38,
                   local_80 + local_e8 * 0x80 * (long)local_88 + local_90 * 0x3fc);
      }
    }
  }
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0x112f18);
  boost::alignment::aligned_allocator<double,_64UL>::deallocate
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,0x112f32);
  return;
}

Assistant:

void dense_gemm(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> const& e2,
	matrix_expression<Mat, cpu_tag>& m,
	typename Mat::value_type alpha
){
	static_assert(std::is_same<typename Mat::orientation,row_major>::value,"target matrix must be row major");
	typedef typename std::common_type<
		typename E1::value_type, typename E2::value_type, typename Mat::value_type
	>::type value_type;

	typedef gemm_block_size<
		typename std::common_type<typename E1::value_type, typename E2::value_type>::type
	> block_size;

	static const std::size_t MC = block_size::mc;
	static const std::size_t NC = block_size::nc;
	static const std::size_t KC = block_size::kc;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocator;
	value_type* A = allocator.allocate(MC * KC);
	value_type* B = allocator.allocate(NC * KC);

	const std::size_t M = m().size1();
	const std::size_t N = m().size2();
	const std::size_t K = e1().size2 ();
	const std::size_t mb = (M+MC-1) / MC;
	const std::size_t nb = (N+NC-1) / NC;
	const std::size_t kb = (K+KC-1) / KC;

	auto storageM = m().raw_storage();
	auto C_ = storageM.values;
	const std::size_t ldc = storageM.leading_dimension;
	for (std::size_t j=0; j<nb; ++j) {
		std::size_t nc = std::min(NC, N - j*NC);

		for (std::size_t l=0; l<kb; ++l) {
			std::size_t kc = std::min(KC, K - l*KC);
			auto Bs = subrange(e2, l*KC, l*KC+kc, j*NC, j*NC+nc);
			pack_B_dense(Bs, B, block_size());

			for (std::size_t i=0; i<mb; ++i) {
				std::size_t mc = std::min(MC, M - i*MC);
				auto As = subrange(e1, i*MC, i*MC+mc, l*KC, l*KC+kc);
				pack_A_dense(As, A, block_size());

				mgemm(
					mc, nc, kc, alpha, A, B,
					&C_[i*MC*ldc+j*NC], ldc , 1, block_size()
				);
			}
		}
	}
	//free storage
	allocator.deallocate(A,MC * KC);
	allocator.deallocate(B,NC * KC);
}